

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [40];
  Option OVar10;
  Option OVar11;
  __m512 afVar12;
  __m512 afVar13;
  undefined1 auVar14 [48];
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  sbyte sVar19;
  char cVar20;
  int iVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [64];
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  int x_2;
  int iVar33;
  long lVar34;
  undefined1 auVar35 [8];
  int x;
  uint uVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [64];
  ulong uVar40;
  long lVar41;
  int z;
  ulong uVar42;
  long lVar43;
  bool bVar44;
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar50;
  uint _c;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  Mat m_1;
  __m512 pad_value;
  __m512 pad_value_1;
  undefined1 local_200 [24];
  int iStack_1e8;
  Allocator *pAStack_1e0;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  undefined8 uStack_1cc;
  undefined1 auStack_1e4 [36];
  ulong local_1c0;
  undefined1 local_180 [8];
  undefined8 uStack_178;
  undefined8 uStack_170;
  float fStack_168;
  float fStack_164;
  Allocator *pAStack_160;
  int iStack_158;
  int iStack_154;
  uint uStack_150;
  undefined8 uStack_14c;
  float fStack_144;
  ulong local_140;
  ulong local_108;
  undefined1 local_100 [64];
  __m512 local_c0 [2];
  
  afVar12 = _local_180;
  auVar14 = _uStack_170;
  uVar25 = (this->super_Padding).top;
  uVar36 = (this->super_Padding).bottom;
  uVar3 = (this->super_Padding).left;
  uVar16 = (this->super_Padding).right;
  uVar27 = (this->super_Padding).front;
  iVar15 = (this->super_Padding).behind;
  if ((((uVar3 == 0 && uVar16 == 0) && (uVar25 == 0 && uVar36 == 0)) && uVar27 == 0) && iVar15 == 0)
  {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar15 = bottom_blob->w;
      iVar28 = bottom_blob->h;
      iVar29 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar15;
      top_blob->h = iVar28;
      top_blob->d = iVar29;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar28 = bottom_blob->elempack;
  uVar40 = bottom_blob->elemsize;
  if (iVar28 == 0) {
    iVar21 = bottom_blob->w;
    uVar50 = bottom_blob->h;
    iVar32 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar29 = bottom_blob->dims;
  }
  else {
    if (((int)uVar40 * 8) / iVar28 == 8) {
      iVar15 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar15;
    }
    local_100._0_8_ = uVar40;
    iVar21 = bottom_blob->w;
    uVar50 = bottom_blob->h;
    iVar32 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar29 = bottom_blob->dims;
    iVar33 = 4;
    uVar42 = (ulong)uVar50;
    uVar26 = (ulong)_c;
    if (iVar28 == 4) {
      _uStack_170 = auVar14;
      switch(iVar29) {
      case 1:
        iVar29 = 1;
        if ((((uVar3 & 3) == 0) && (uVar25 = uVar3 + iVar21 * 4 + uVar16, (uVar25 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,(int)uVar25 >> 2,(uVar40 >> 2) << ((uVar16 & 3) == 0) * '\x02',4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,0,0,(this->super_Padding).left / 4,
                       (this->super_Padding).right / 4,(__m128 *)local_180);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        iVar29 = 2;
        if ((((uVar25 & 3) == 0) && (uVar25 = uVar25 + uVar50 * 4 + uVar36, (uVar25 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,(int)uVar25 >> 2,
                      (uVar40 >> 2) << ((uVar36 & 3) == 0) * '\x02',4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,(this->super_Padding).top / 4,
                       (this->super_Padding).bottom / 4,(this->super_Padding).left,
                       (this->super_Padding).right,(__m128 *)local_180);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar17 = uVar27 + _c * 4 + iVar15;
        sVar19 = ((uVar17 & 3) == 0) * '\x02';
        iVar29 = 3;
        if ((uVar17 & 7) == 0) {
          sVar19 = 3;
        }
        if ((((uVar27 & 3) == 0) && ((uVar17 & 7) == 4)) &&
           ((uVar17 == _c * 4 || ((this->super_Padding).type == 0)))) {
          uVar17 = (int)uVar17 >> 2;
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,uVar17,
                      (uVar40 >> 2) << sVar19,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            uVar40 = (long)(this->super_Padding).front / -4;
            if ((int)uVar17 < 1) {
              uVar17 = 0;
            }
            local_108 = CONCAT44(local_108._4_4_,(int)uVar40);
            uVar40 = uVar40 & 0xffffffff;
            for (uVar26 = 0; afVar12 = _local_180, OVar10 = _local_200, uVar26 != uVar17;
                uVar26 = uVar26 + 1) {
              uVar42 = top_blob->elemsize;
              pauVar23 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar26 * uVar42 + (long)top_blob->data);
              uStack_178._0_4_ = 0.0;
              uStack_178._4_4_ = 0.0;
              local_180 = (undefined1  [8])pauVar23;
              uStack_170._0_4_ = (float)(int)uVar42;
              uStack_170._4_4_ = (float)(int)(uVar42 >> 0x20);
              _fStack_164 = afVar12._28_36_;
              fStack_168 = (float)top_blob->elempack;
              afVar13 = _local_180;
              _iStack_158 = afVar12._40_24_;
              _local_180 = afVar13._0_32_;
              pAStack_160 = top_blob->allocator;
              auVar9 = _local_180;
              iStack_154 = top_blob->w;
              uStack_150 = top_blob->h;
              uStack_14c._0_4_ = 1.4013e-45;
              fStack_144 = afVar12[0xf];
              uStack_14c._4_4_ = (float)top_blob->d;
              uVar18 = (long)top_blob->h * (long)top_blob->w;
              iStack_158 = top_blob->dims + -1;
              _local_180 = CONCAT440(iStack_158,auVar9);
              local_140 = (uVar42 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar42;
              if (top_blob->dims == 4) {
                local_140 = uVar18;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar46._4_4_ = fVar1;
                auVar46._0_4_ = fVar1;
                auVar46._8_4_ = fVar1;
                auVar46._12_4_ = fVar1;
              }
              else {
                auVar46 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar26 * 0x10);
              }
              local_c0[0][0] = (float)auVar46._0_4_;
              local_c0[0][1] = (float)auVar46._4_4_;
              local_c0[0][2] = (float)auVar46._8_4_;
              local_c0[0][3] = (float)auVar46._12_4_;
              uVar25 = (int)local_108 + (int)uVar26;
              if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
                iVar15 = top_blob->d * (int)local_140;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
                  *pauVar23 = auVar46;
                  pauVar23 = pauVar23 + 1;
                }
              }
              else {
                iVar15 = bottom_blob->w;
                pvVar6 = bottom_blob->data;
                uVar42 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                pauVar38 = (undefined1 (*) [16])(uVar25 * sVar5 * uVar42 + (long)pvVar6);
                local_200._8_8_ = 0;
                local_200._0_8_ = pauVar38;
                local_200._16_8_ = uVar42;
                auStack_1e4 = OVar10._28_36_;
                iStack_1e8 = bottom_blob->elempack;
                OVar11 = _local_200;
                _iStack_1d8 = OVar10._40_24_;
                _local_200 = OVar11._0_32_;
                pAStack_1e0 = bottom_blob->allocator;
                auVar9 = _local_200;
                iStack_1d4._0_1_ = (bool)(char)iVar15;
                iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                iStack_1d0 = bottom_blob->h;
                uStack_1cc._0_1_ = true;
                uStack_1cc._1_1_ = false;
                uStack_1cc._2_1_ = false;
                uStack_1cc._3_1_ = false;
                auStack_1e4._32_4_ = OVar10._60_4_;
                uStack_1cc._4_4_ = bottom_blob->d;
                uVar18 = (long)bottom_blob->h * (long)iVar15;
                iStack_1d8 = bottom_blob->dims + -1;
                _local_200 = CONCAT440(iStack_1d8,auVar9);
                local_1c0 = (uVar42 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar42;
                if (bottom_blob->dims == 4) {
                  local_1c0 = uVar18;
                }
                iVar15 = (this->super_Padding).type;
                local_100._0_8_ = uVar26;
                if (iVar15 == 0) {
                  padding_constant_pack4_sse
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m128 *)local_c0);
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 1) {
                  iVar15 = (this->super_Padding).left;
                  iVar29 = 0;
                  iVar28 = 0;
                  if (iVar15 < 1) {
                    iVar15 = iVar28;
                  }
                  iVar21 = (this->super_Padding).right;
                  if (iVar21 < 1) {
                    iVar21 = iVar28;
                  }
                  iVar32 = (this->super_Padding).top;
                  if (iVar32 < 1) {
                    iVar32 = iVar28;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  for (; iVar29 != iVar32; iVar29 = iVar29 + 1) {
                    auVar47 = *pauVar38;
                    iVar33 = iVar15;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                    }
                    lVar34 = 0;
                    for (iVar33 = 0; iVar33 < iStack_1d4; iVar33 = iVar33 + 1) {
                      auVar47 = *(undefined1 (*) [16])
                                 ((long)pvVar6 + lVar34 + sVar5 * uVar42 * uVar40);
                      *(undefined1 (*) [16])(*pauVar23 + lVar34) = auVar47;
                      lVar34 = lVar34 + 0x10;
                    }
                    pauVar23 = (undefined1 (*) [16])(*pauVar23 + lVar34);
                    iVar33 = iVar21;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                    }
                  }
                  for (iVar29 = 0; iVar29 < iStack_1d0; iVar29 = iVar29 + 1) {
                    auVar47 = *pauVar38;
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                    }
                    for (iVar32 = 0; iVar33 = iVar21, iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar47 = *pauVar38;
                      *pauVar23 = auVar47;
                      pauVar38 = pauVar38 + 1;
                      pauVar23 = pauVar23 + 1;
                    }
                    while (iVar33 != 0) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                      iVar33 = iVar33 + -1;
                    }
                  }
                  pauVar38 = (undefined1 (*) [16])((long)pauVar38 + (long)(iStack_1d4 << 2) * -4);
                  iVar29 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar29;
                  }
                  for (; iVar29 != iVar28; iVar29 = iVar29 + 1) {
                    auVar47 = *pauVar38;
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                    }
                    lVar34 = 0;
                    for (iVar32 = 0; iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar47 = *(undefined1 (*) [16])(*pauVar38 + lVar34);
                      *(undefined1 (*) [16])(*pauVar23 + lVar34) = auVar47;
                      lVar34 = lVar34 + 0x10;
                    }
                    pauVar23 = (undefined1 (*) [16])(*pauVar23 + lVar34);
                    iVar32 = iVar21;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar23 = auVar47;
                      pauVar23 = pauVar23 + 1;
                    }
                  }
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 2) {
                  iVar15 = (this->super_Padding).top;
                  uVar25 = (this->super_Padding).left;
                  pauVar23 = (undefined1 (*) [16])
                             ((long)(iStack_1d4 * iVar15 * 4) * 4 + local_200._0_8_);
                  uVar42 = 0;
                  uVar26 = 0;
                  if (0 < (int)uVar25) {
                    uVar26 = (ulong)uVar25;
                  }
                  uVar36 = (this->super_Padding).right;
                  uVar18 = (ulong)uVar36;
                  if ((int)uVar36 < 1) {
                    uVar18 = uVar42;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  if (iVar15 < 1) {
                    iVar15 = 0;
                  }
                  lVar34 = uVar26 * 0x10;
                  lVar31 = uVar18 * 0x10;
                  auVar35 = local_180;
                  while( true ) {
                    if ((int)uVar42 == iVar15) break;
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar35 + lVar43) =
                           *(undefined1 (*) [16])(pauVar23[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x10;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    lVar41 = -0x20;
                    pauVar38 = pauVar23;
                    for (iVar29 = 0; iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [16])auVar35 = *pauVar38;
                      pauVar38 = pauVar38 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                    for (; lVar31 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar35 = *(undefined1 (*) [16])(*pauVar38 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                    pauVar23 = pauVar23 + -(long)iStack_1d4;
                    uVar42 = (ulong)((int)uVar42 + 1);
                  }
                  for (iVar15 = 0; iVar15 < iStack_1d0; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar35 + lVar43) =
                           *(undefined1 (*) [16])(pauVar23[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x10;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    for (iVar29 = 0; lVar41 = -0x20, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [16])auVar35 = *pauVar23;
                      pauVar23 = pauVar23 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                    for (; lVar31 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar35 = *(undefined1 (*) [16])(*pauVar23 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                  }
                  pauVar23 = pauVar23 + (long)iStack_1d4 * -2;
                  iVar15 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar15;
                  }
                  for (; iVar15 != iVar28; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar35 + lVar43) =
                           *(undefined1 (*) [16])(pauVar23[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x10;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    pauVar38 = pauVar23;
                    for (iVar29 = 0; lVar41 = -0x20, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [16])auVar35 = *pauVar38;
                      pauVar38 = pauVar38 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                    for (; lVar31 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar35 = *(undefined1 (*) [16])(*pauVar38 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x10);
                    }
                    pauVar23 = pauVar23 + -(long)iStack_1d4;
                  }
                }
                if ((Allocator *)local_200._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_200._8_8_ =
                       *(int *)(_func_int ***)local_200._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_200._8_8_ == 0) {
                    if (pAStack_1e0 == (Allocator *)0x0) {
                      free((void *)local_200._0_8_);
                    }
                    else {
                      (*pAStack_1e0->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar26 = local_100._0_8_;
                if (uStack_178 != (int *)0x0) {
                  LOCK();
                  *uStack_178 = *uStack_178 + -1;
                  UNLOCK();
                  if (*uStack_178 == 0) {
                    if (pAStack_160 == (Allocator *)0x0) {
                      free((void *)local_180);
                      uVar26 = local_100._0_8_;
                    }
                    else {
                      (*pAStack_160->_vptr_Allocator[3])();
                      uVar26 = local_100._0_8_;
                    }
                  }
                }
              }
              uVar40 = (ulong)((int)uVar40 + 1);
            }
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        iVar29 = iVar33;
        if ((this->super_Padding).type == 0) {
          uVar27 = uVar27 + iVar15 + iVar32;
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,uVar27,_c,uVar40,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar27 < 1) {
              uVar27 = 0;
            }
            if ((int)_c < 1) {
              uVar26 = 0;
            }
            for (uVar40 = 0; uVar40 != uVar26; uVar40 = uVar40 + 1) {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar47._4_4_ = fVar1;
                auVar47._0_4_ = fVar1;
                auVar47._8_4_ = fVar1;
                auVar47._12_4_ = fVar1;
              }
              else {
                auVar47 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar40 * 0x10);
              }
              auVar45 = ZEXT1664(auVar47);
              local_c0[0][0] = (float)auVar47._0_4_;
              local_c0[0][1] = (float)auVar47._4_4_;
              local_c0[0][2] = (float)auVar47._8_4_;
              local_c0[0][3] = (float)auVar47._12_4_;
              local_100._0_16_ = auVar47;
              for (uVar42 = 0; afVar12 = _local_180, OVar10 = _local_200, uVar42 != uVar27;
                  uVar42 = uVar42 + 1) {
                sVar5 = top_blob->elemsize;
                local_140 = (long)top_blob->h * (long)top_blob->w;
                pauVar23 = (undefined1 (*) [16])
                           ((long)top_blob->data +
                           uVar42 * sVar5 * local_140 + top_blob->cstep * uVar40 * sVar5);
                uStack_178._0_4_ = 0.0;
                uStack_178._4_4_ = 0.0;
                local_180 = (undefined1  [8])pauVar23;
                uStack_170._0_4_ = (float)(int)sVar5;
                uStack_170._4_4_ = (float)(int)(sVar5 >> 0x20);
                _fStack_164 = afVar12._28_36_;
                fStack_168 = (float)top_blob->elempack;
                pAStack_160 = top_blob->allocator;
                iStack_158 = 2;
                iStack_154 = top_blob->w;
                uStack_150 = top_blob->h;
                fStack_144 = afVar12[0xf];
                uStack_14c._0_4_ = 1.4013e-45;
                uStack_14c._4_4_ = 1.4013e-45;
                uVar25 = (int)uVar42 - (this->super_Padding).front;
                if ((int)uVar25 < 0 || iVar32 <= (int)uVar25) {
                  uVar18 = local_140 & 0xffffffff;
                  if ((int)local_140 < 1) {
                    uVar18 = 0;
                  }
                  while (iVar15 = (int)uVar18, uVar18 = (ulong)(iVar15 - 1), iVar15 != 0) {
                    *pauVar23 = auVar45._0_16_;
                    pauVar23 = pauVar23 + 1;
                  }
                }
                else {
                  iVar15 = bottom_blob->w;
                  local_200._16_8_ = bottom_blob->elemsize;
                  local_1c0 = (long)bottom_blob->h * (long)iVar15;
                  local_200._8_8_ = 0;
                  local_200._0_8_ =
                       (long)bottom_blob->data +
                       (ulong)uVar25 * local_200._16_8_ * local_1c0 +
                       bottom_blob->cstep * uVar40 * local_200._16_8_;
                  auStack_1e4 = OVar10._28_36_;
                  iStack_1e8 = bottom_blob->elempack;
                  pAStack_1e0 = bottom_blob->allocator;
                  iStack_1d8 = 2;
                  iStack_1d4._0_1_ = (bool)(char)iVar15;
                  iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                  iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                  iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                  iStack_1d0 = bottom_blob->h;
                  auStack_1e4._32_4_ = OVar10._60_4_;
                  uStack_1cc._0_1_ = true;
                  uStack_1cc._1_1_ = false;
                  uStack_1cc._2_1_ = false;
                  uStack_1cc._3_1_ = false;
                  uStack_1cc._4_1_ = true;
                  uStack_1cc._5_1_ = false;
                  uStack_1cc._6_1_ = false;
                  uStack_1cc._7_1_ = false;
                  padding_constant_pack4_sse
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m128 *)local_c0);
                  auVar45 = ZEXT1664(local_100._0_16_);
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar28 == 8) {
      switch(iVar29) {
      case 1:
        uVar16 = uVar3 + iVar21 * 8 + uVar16;
        if (((uVar3 | uVar16) & 7) == 0 && (this->super_Padding).type == 0) {
          Mat::create(top_blob,(int)uVar16 / 8,uVar40 & 0xfffffffffffffff8,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            uStack_170._0_4_ = (float)local_180._4_4_;
            uStack_170._4_4_ = (float)local_180._4_4_;
            fStack_168 = (float)local_180._4_4_;
            fStack_164 = (float)local_180._4_4_;
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,0,0,(this->super_Padding).left / 8,
                       (this->super_Padding).right / 8,(__m256 *)local_180);
            return 0;
          }
          return -100;
        }
LAB_003c053d:
        iVar29 = 1;
        break;
      case 2:
        uVar36 = uVar25 + uVar50 * 8 + uVar36;
        if (((uVar25 | uVar36) & 7) == 0 && (this->super_Padding).type == 0) {
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,(int)uVar36 / 8,uVar40 & 0xfffffffffffffff8,8
                      ,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            uStack_170._0_4_ = (float)local_180._4_4_;
            uStack_170._4_4_ = (float)local_180._4_4_;
            fStack_168 = (float)local_180._4_4_;
            fStack_164 = (float)local_180._4_4_;
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,(this->super_Padding).top / 8,
                       (this->super_Padding).bottom / 8,(this->super_Padding).left,
                       (this->super_Padding).right,(__m256 *)local_180);
            return 0;
          }
          return -100;
        }
LAB_003c09ed:
        iVar29 = 2;
        break;
      case 3:
        uVar17 = uVar27 + _c * 8 + iVar15;
        sVar19 = ((uVar17 & 3) == 0) * '\x02';
        iVar29 = 3;
        if ((uVar17 & 7) == 0) {
          sVar19 = 3;
        }
        if ((((uVar27 | uVar17) & 7) == 0) &&
           ((uVar17 == _c * 8 || ((this->super_Padding).type == 0)))) {
          uVar26 = (long)(int)uVar17 / 8 & 0xffffffff;
          iVar15 = (int)((long)(int)uVar17 / 8);
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,iVar15,
                      (uVar40 >> 3) << sVar19,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            uVar40 = (long)(this->super_Padding).front / -8;
            if (iVar15 < 1) {
              uVar26 = 0;
            }
            local_108 = CONCAT44(local_108._4_4_,(int)uVar40);
            uVar40 = uVar40 & 0xffffffff;
            for (uVar42 = 0; afVar12 = _local_180, OVar10 = _local_200, uVar42 != uVar26;
                uVar42 = uVar42 + 1) {
              uVar18 = top_blob->elemsize;
              pauVar22 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar42 * uVar18 + (long)top_blob->data);
              uStack_178._0_4_ = 0.0;
              uStack_178._4_4_ = 0.0;
              local_180 = (undefined1  [8])pauVar22;
              uStack_170._0_4_ = (float)(int)uVar18;
              uStack_170._4_4_ = (float)(int)(uVar18 >> 0x20);
              _fStack_164 = afVar12._28_36_;
              fStack_168 = (float)top_blob->elempack;
              afVar13 = _local_180;
              _iStack_158 = afVar12._40_24_;
              _local_180 = afVar13._0_32_;
              pAStack_160 = top_blob->allocator;
              auVar9 = _local_180;
              iStack_154 = top_blob->w;
              uStack_150 = top_blob->h;
              uStack_14c._0_4_ = 1.4013e-45;
              fStack_144 = afVar12[0xf];
              uStack_14c._4_4_ = (float)top_blob->d;
              uVar30 = (long)top_blob->h * (long)top_blob->w;
              iStack_158 = top_blob->dims + -1;
              _local_180 = CONCAT440(iStack_158,auVar9);
              local_140 = (uVar18 * uVar30 + 0xf & 0xfffffffffffffff0) / uVar18;
              if (top_blob->dims == 4) {
                local_140 = uVar30;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar48._4_4_ = fVar1;
                auVar48._0_4_ = fVar1;
                auVar48._8_4_ = fVar1;
                auVar48._12_4_ = fVar1;
                auVar48._16_4_ = fVar1;
                auVar48._20_4_ = fVar1;
                auVar48._24_4_ = fVar1;
                auVar48._28_4_ = fVar1;
              }
              else {
                auVar48 = *(undefined1 (*) [32])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar42 * 0x20);
              }
              local_c0[0][0] = (float)auVar48._0_4_;
              local_c0[0][1] = (float)auVar48._4_4_;
              local_c0[0][2] = (float)auVar48._8_4_;
              local_c0[0][3] = (float)auVar48._12_4_;
              local_c0[0][4] = (float)auVar48._16_4_;
              local_c0[0][5] = (float)auVar48._20_4_;
              local_c0[0][6] = (float)auVar48._24_4_;
              local_c0[0][7] = (float)auVar48._28_4_;
              uVar25 = (int)local_108 + (int)uVar42;
              if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
                iVar15 = top_blob->d * (int)local_140;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
                  *pauVar22 = auVar48;
                  pauVar22 = pauVar22 + 1;
                }
              }
              else {
                iVar15 = bottom_blob->w;
                pvVar6 = bottom_blob->data;
                uVar18 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                pauVar37 = (undefined1 (*) [32])(uVar25 * sVar5 * uVar18 + (long)pvVar6);
                local_200._8_8_ = 0;
                local_200._0_8_ = pauVar37;
                local_200._16_8_ = uVar18;
                auStack_1e4 = OVar10._28_36_;
                iStack_1e8 = bottom_blob->elempack;
                OVar11 = _local_200;
                _iStack_1d8 = OVar10._40_24_;
                _local_200 = OVar11._0_32_;
                pAStack_1e0 = bottom_blob->allocator;
                auVar9 = _local_200;
                iStack_1d4._0_1_ = (bool)(char)iVar15;
                iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                iStack_1d0 = bottom_blob->h;
                uStack_1cc._0_1_ = true;
                uStack_1cc._1_1_ = false;
                uStack_1cc._2_1_ = false;
                uStack_1cc._3_1_ = false;
                auStack_1e4._32_4_ = OVar10._60_4_;
                uStack_1cc._4_4_ = bottom_blob->d;
                uVar30 = (long)bottom_blob->h * (long)iVar15;
                iStack_1d8 = bottom_blob->dims + -1;
                _local_200 = CONCAT440(iStack_1d8,auVar9);
                local_1c0 = (uVar18 * uVar30 + 0xf & 0xfffffffffffffff0) / uVar18;
                if (bottom_blob->dims == 4) {
                  local_1c0 = uVar30;
                }
                iVar15 = (this->super_Padding).type;
                local_100._0_8_ = uVar42;
                if (iVar15 == 0) {
                  padding_constant_pack8_avx
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m256 *)local_c0);
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 1) {
                  iVar15 = (this->super_Padding).left;
                  iVar29 = 0;
                  iVar28 = 0;
                  if (iVar15 < 1) {
                    iVar15 = iVar28;
                  }
                  iVar21 = (this->super_Padding).right;
                  if (iVar21 < 1) {
                    iVar21 = iVar28;
                  }
                  iVar32 = (this->super_Padding).top;
                  if (iVar32 < 1) {
                    iVar32 = iVar28;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  for (; iVar29 != iVar32; iVar29 = iVar29 + 1) {
                    auVar49 = *pauVar37;
                    iVar33 = iVar15;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                    }
                    lVar34 = 0;
                    for (iVar33 = 0; iVar33 < iStack_1d4; iVar33 = iVar33 + 1) {
                      auVar49 = *(undefined1 (*) [32])
                                 ((long)pvVar6 + lVar34 + sVar5 * uVar18 * uVar40);
                      *(undefined1 (*) [32])(*pauVar22 + lVar34) = auVar49;
                      lVar34 = lVar34 + 0x20;
                    }
                    pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar34);
                    iVar33 = iVar21;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                    }
                  }
                  for (iVar29 = 0; iVar29 < iStack_1d0; iVar29 = iVar29 + 1) {
                    auVar49 = *pauVar37;
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                    }
                    for (iVar32 = 0; iVar33 = iVar21, iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar49 = *pauVar37;
                      *pauVar22 = auVar49;
                      pauVar37 = pauVar37 + 1;
                      pauVar22 = pauVar22 + 1;
                    }
                    while (iVar33 != 0) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                      iVar33 = iVar33 + -1;
                    }
                  }
                  pauVar37 = (undefined1 (*) [32])((long)pauVar37 + (long)(iStack_1d4 << 3) * -4);
                  iVar29 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar29;
                  }
                  for (; iVar29 != iVar28; iVar29 = iVar29 + 1) {
                    auVar49 = *pauVar37;
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                    }
                    lVar34 = 0;
                    for (iVar32 = 0; iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar49 = *(undefined1 (*) [32])(*pauVar37 + lVar34);
                      *(undefined1 (*) [32])(*pauVar22 + lVar34) = auVar49;
                      lVar34 = lVar34 + 0x20;
                    }
                    pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar34);
                    iVar32 = iVar21;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      *pauVar22 = auVar49;
                      pauVar22 = pauVar22 + 1;
                    }
                  }
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 2) {
                  iVar15 = (this->super_Padding).top;
                  uVar25 = (this->super_Padding).left;
                  pauVar22 = (undefined1 (*) [32])
                             ((long)(iStack_1d4 * iVar15 * 8) * 4 + local_200._0_8_);
                  uVar18 = 0;
                  uVar42 = 0;
                  if (0 < (int)uVar25) {
                    uVar42 = (ulong)uVar25;
                  }
                  uVar36 = (this->super_Padding).right;
                  uVar30 = (ulong)uVar36;
                  if ((int)uVar36 < 1) {
                    uVar30 = uVar18;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  if (iVar15 < 1) {
                    iVar15 = 0;
                  }
                  lVar34 = uVar42 * 0x20;
                  lVar31 = uVar30 * 0x20;
                  auVar35 = local_180;
                  while( true ) {
                    if ((int)uVar18 == iVar15) break;
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])(*(undefined1 (*) [32])auVar35 + lVar43) =
                           *(undefined1 (*) [32])(pauVar22[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x20;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    lVar41 = -0x40;
                    pauVar37 = pauVar22;
                    for (iVar29 = 0; iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [32])auVar35 = *pauVar37;
                      pauVar37 = pauVar37 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                    for (; lVar31 + lVar41 != -0x40; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])auVar35 = *(undefined1 (*) [32])(*pauVar37 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                    pauVar22 = pauVar22 + -(long)iStack_1d4;
                    uVar18 = (ulong)((int)uVar18 + 1);
                  }
                  for (iVar15 = 0; iVar15 < iStack_1d0; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])(*(undefined1 (*) [32])auVar35 + lVar43) =
                           *(undefined1 (*) [32])(pauVar22[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x20;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    for (iVar29 = 0; lVar41 = -0x40, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [32])auVar35 = *pauVar22;
                      pauVar22 = pauVar22 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                    for (; lVar31 + lVar41 != -0x40; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])auVar35 = *(undefined1 (*) [32])(*pauVar22 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                  }
                  pauVar22 = pauVar22 + (long)iStack_1d4 * -2;
                  iVar15 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar15;
                  }
                  for (; iVar15 != iVar28; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])(*(undefined1 (*) [32])auVar35 + lVar43) =
                           *(undefined1 (*) [32])(pauVar22[(int)uVar25] + lVar41);
                      lVar43 = lVar43 + 0x20;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    pauVar37 = pauVar22;
                    for (iVar29 = 0; lVar41 = -0x40, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      *(undefined1 (*) [32])auVar35 = *pauVar37;
                      pauVar37 = pauVar37 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                    for (; lVar31 + lVar41 != -0x40; lVar41 = lVar41 + -0x20) {
                      *(undefined1 (*) [32])auVar35 = *(undefined1 (*) [32])(*pauVar37 + lVar41);
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x20);
                    }
                    pauVar22 = pauVar22 + -(long)iStack_1d4;
                  }
                }
                if ((Allocator *)local_200._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_200._8_8_ =
                       *(int *)(_func_int ***)local_200._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_200._8_8_ == 0) {
                    if (pAStack_1e0 == (Allocator *)0x0) {
                      free((void *)local_200._0_8_);
                    }
                    else {
                      (*pAStack_1e0->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar42 = local_100._0_8_;
                if (uStack_178 != (int *)0x0) {
                  LOCK();
                  *uStack_178 = *uStack_178 + -1;
                  UNLOCK();
                  if (*uStack_178 == 0) {
                    if (pAStack_160 == (Allocator *)0x0) {
                      free((void *)local_180);
                      uVar42 = local_100._0_8_;
                    }
                    else {
                      (*pAStack_160->_vptr_Allocator[3])();
                      uVar42 = local_100._0_8_;
                    }
                  }
                }
              }
              uVar40 = (ulong)((int)uVar40 + 1);
            }
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        iVar29 = iVar33;
        if ((this->super_Padding).type == 0) {
          uVar27 = uVar27 + iVar15 + iVar32;
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,uVar27,_c,uVar40,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar27 < 1) {
              uVar27 = 0;
            }
            if ((int)_c < 1) {
              uVar26 = 0;
            }
            for (uVar40 = 0; uVar40 != uVar26; uVar40 = uVar40 + 1) {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar49._4_4_ = fVar1;
                auVar49._0_4_ = fVar1;
                auVar49._8_4_ = fVar1;
                auVar49._12_4_ = fVar1;
                auVar49._16_4_ = fVar1;
                auVar49._20_4_ = fVar1;
                auVar49._24_4_ = fVar1;
                auVar49._28_4_ = fVar1;
              }
              else {
                auVar49 = *(undefined1 (*) [32])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar40 * 0x20);
              }
              auVar45 = ZEXT3264(auVar49);
              local_c0[0][0] = (float)auVar49._0_4_;
              local_c0[0][1] = (float)auVar49._4_4_;
              local_c0[0][2] = (float)auVar49._8_4_;
              local_c0[0][3] = (float)auVar49._12_4_;
              local_c0[0][4] = (float)auVar49._16_4_;
              local_c0[0][5] = (float)auVar49._20_4_;
              local_c0[0][6] = (float)auVar49._24_4_;
              local_c0[0][7] = (float)auVar49._28_4_;
              local_100._0_32_ = auVar49;
              for (uVar42 = 0; afVar12 = _local_180, OVar10 = _local_200, uVar42 != uVar27;
                  uVar42 = uVar42 + 1) {
                sVar5 = top_blob->elemsize;
                local_140 = (long)top_blob->h * (long)top_blob->w;
                pauVar22 = (undefined1 (*) [32])
                           ((long)top_blob->data +
                           uVar42 * sVar5 * local_140 + top_blob->cstep * uVar40 * sVar5);
                uStack_178._0_4_ = 0.0;
                uStack_178._4_4_ = 0.0;
                local_180 = (undefined1  [8])pauVar22;
                uStack_170._0_4_ = (float)(int)sVar5;
                uStack_170._4_4_ = (float)(int)(sVar5 >> 0x20);
                _fStack_164 = afVar12._28_36_;
                fStack_168 = (float)top_blob->elempack;
                pAStack_160 = top_blob->allocator;
                iStack_158 = 2;
                iStack_154 = top_blob->w;
                uStack_150 = top_blob->h;
                fStack_144 = afVar12[0xf];
                uStack_14c._0_4_ = 1.4013e-45;
                uStack_14c._4_4_ = 1.4013e-45;
                uVar25 = (int)uVar42 - (this->super_Padding).front;
                if ((int)uVar25 < 0 || iVar32 <= (int)uVar25) {
                  uVar18 = local_140 & 0xffffffff;
                  if ((int)local_140 < 1) {
                    uVar18 = 0;
                  }
                  while (iVar15 = (int)uVar18, uVar18 = (ulong)(iVar15 - 1), iVar15 != 0) {
                    *pauVar22 = auVar45._0_32_;
                    pauVar22 = pauVar22 + 1;
                  }
                }
                else {
                  iVar15 = bottom_blob->w;
                  local_200._16_8_ = bottom_blob->elemsize;
                  local_1c0 = (long)bottom_blob->h * (long)iVar15;
                  local_200._8_8_ = 0;
                  local_200._0_8_ =
                       (long)bottom_blob->data +
                       (ulong)uVar25 * local_200._16_8_ * local_1c0 +
                       bottom_blob->cstep * uVar40 * local_200._16_8_;
                  auStack_1e4 = OVar10._28_36_;
                  iStack_1e8 = bottom_blob->elempack;
                  pAStack_1e0 = bottom_blob->allocator;
                  iStack_1d8 = 2;
                  iStack_1d4._0_1_ = (bool)(char)iVar15;
                  iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                  iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                  iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                  iStack_1d0 = bottom_blob->h;
                  auStack_1e4._32_4_ = OVar10._60_4_;
                  uStack_1cc._0_1_ = true;
                  uStack_1cc._1_1_ = false;
                  uStack_1cc._2_1_ = false;
                  uStack_1cc._3_1_ = false;
                  uStack_1cc._4_1_ = true;
                  uStack_1cc._5_1_ = false;
                  uStack_1cc._6_1_ = false;
                  uStack_1cc._7_1_ = false;
                  padding_constant_pack8_avx
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m256 *)local_c0);
                  auVar45 = ZEXT3264(local_100._0_32_);
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar28 == 0x10) {
      local_108 = uVar42;
      switch(iVar29) {
      case 1:
        if (((uVar3 | uVar16 + uVar3) & 0xf) == 0 && (this->super_Padding).type == 0) {
          Mat::create(top_blob,(int)(uVar16 + uVar3 + iVar21 * 0x10) / 0x10,
                      uVar40 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            auVar45 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
            _local_180 = (__m512)vmovdqa64_avx512f(auVar45);
            padding_constant_pack16_avx512
                      (bottom_blob,top_blob,0,0,(this->super_Padding).left / 0x10,
                       (this->super_Padding).right / 0x10,(__m512 *)local_180);
            return 0;
          }
          return -100;
        }
        goto LAB_003c053d;
      case 2:
        uVar36 = uVar36 + uVar25 + uVar50 * 0x10;
        if (((uVar25 | uVar36) & 0xf) == 0 && (this->super_Padding).type == 0) {
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,(int)uVar36 / 0x10,
                      uVar40 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            auVar45 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
            _local_180 = (__m512)vmovdqa64_avx512f(auVar45);
            padding_constant_pack16_avx512
                      (bottom_blob,top_blob,(this->super_Padding).top / 0x10,
                       (this->super_Padding).bottom / 0x10,(this->super_Padding).left,
                       (this->super_Padding).right,(__m512 *)local_180);
            return 0;
          }
          return -100;
        }
        goto LAB_003c09ed;
      case 3:
        uVar17 = uVar27 + iVar15 + _c * 0x10;
        if ((uVar17 & 0xf) == 0) {
          cVar20 = '\x10';
        }
        else if ((uVar17 & 7) == 0) {
          cVar20 = '\b';
        }
        else {
          cVar20 = ((uVar17 & 3) == 0) * '\x03' + '\x01';
        }
        iVar29 = 3;
        if ((((uVar27 & 0xf) == 0) && (cVar20 == '\x10')) &&
           ((uVar17 == _c * 0x10 || ((this->super_Padding).type == 0)))) {
          uVar26 = (long)(int)uVar17 / 0x10 & 0xffffffff;
          iVar15 = (int)((long)(int)uVar17 / 0x10);
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,iVar15,
                      uVar40 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            uVar40 = (long)(this->super_Padding).front / -0x10;
            if (iVar15 < 1) {
              uVar26 = 0;
            }
            local_108 = CONCAT44(local_108._4_4_,(int)uVar40);
            uVar40 = uVar40 & 0xffffffff;
            for (uVar42 = 0; afVar12 = _local_180, OVar10 = _local_200, uVar42 != uVar26;
                uVar42 = uVar42 + 1) {
              uVar18 = top_blob->elemsize;
              pauVar24 = (undefined1 (*) [64])
                         (top_blob->cstep * uVar42 * uVar18 + (long)top_blob->data);
              uStack_178._0_4_ = 0.0;
              uStack_178._4_4_ = 0.0;
              local_180 = (undefined1  [8])pauVar24;
              uStack_170._0_4_ = (float)(int)uVar18;
              uStack_170._4_4_ = (float)(int)(uVar18 >> 0x20);
              _fStack_164 = afVar12._28_36_;
              fStack_168 = (float)top_blob->elempack;
              afVar13 = _local_180;
              _iStack_158 = afVar12._40_24_;
              _local_180 = afVar13._0_32_;
              pAStack_160 = top_blob->allocator;
              auVar9 = _local_180;
              iStack_154 = top_blob->w;
              uStack_150 = top_blob->h;
              uStack_14c._0_4_ = 1.4013e-45;
              fStack_144 = afVar12[0xf];
              uStack_14c._4_4_ = (float)top_blob->d;
              uVar30 = (long)top_blob->h * (long)top_blob->w;
              iStack_158 = top_blob->dims + -1;
              _local_180 = CONCAT440(iStack_158,auVar9);
              local_140 = (uVar18 * uVar30 + 0xf & 0xfffffffffffffff0) / uVar18;
              if (top_blob->dims == 4) {
                local_140 = uVar30;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                auVar45 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              }
              else {
                auVar45 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             ((long)(this->super_Padding).per_channel_pad_data.data
                                             + uVar42 * 0x40));
              }
              local_c0[0] = (__m512)vmovdqa64_avx512f(auVar45);
              uVar25 = (int)local_108 + (int)uVar42;
              if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
                iVar15 = top_blob->d * (int)local_140;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
                  auVar2 = vmovdqu64_avx512f(auVar45);
                  *pauVar24 = auVar2;
                  pauVar24 = pauVar24 + 1;
                }
              }
              else {
                iVar15 = bottom_blob->w;
                pvVar6 = bottom_blob->data;
                uVar18 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                pauVar39 = (undefined1 (*) [64])(uVar25 * sVar5 * uVar18 + (long)pvVar6);
                local_200._8_8_ = 0;
                local_200._0_8_ = pauVar39;
                local_200._16_8_ = uVar18;
                auStack_1e4 = OVar10._28_36_;
                iStack_1e8 = bottom_blob->elempack;
                OVar11 = _local_200;
                _iStack_1d8 = OVar10._40_24_;
                _local_200 = OVar11._0_32_;
                pAStack_1e0 = bottom_blob->allocator;
                auVar9 = _local_200;
                iStack_1d4._0_1_ = (bool)(char)iVar15;
                iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                iStack_1d0 = bottom_blob->h;
                uStack_1cc._0_1_ = true;
                uStack_1cc._1_1_ = false;
                uStack_1cc._2_1_ = false;
                uStack_1cc._3_1_ = false;
                auStack_1e4._32_4_ = OVar10._60_4_;
                uStack_1cc._4_4_ = bottom_blob->d;
                uVar30 = (long)bottom_blob->h * (long)iVar15;
                iStack_1d8 = bottom_blob->dims + -1;
                _local_200 = CONCAT440(iStack_1d8,auVar9);
                local_1c0 = (uVar18 * uVar30 + 0xf & 0xfffffffffffffff0) / uVar18;
                if (bottom_blob->dims == 4) {
                  local_1c0 = uVar30;
                }
                iVar15 = (this->super_Padding).type;
                local_100._0_8_ = uVar42;
                if (iVar15 == 0) {
                  padding_constant_pack16_avx512
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,local_c0);
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 1) {
                  iVar15 = (this->super_Padding).left;
                  iVar29 = 0;
                  iVar28 = 0;
                  if (iVar15 < 1) {
                    iVar15 = iVar28;
                  }
                  iVar21 = (this->super_Padding).right;
                  if (iVar21 < 1) {
                    iVar21 = iVar28;
                  }
                  iVar32 = (this->super_Padding).top;
                  if (iVar32 < 1) {
                    iVar32 = iVar28;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  for (; iVar29 != iVar32; iVar29 = iVar29 + 1) {
                    auVar45 = vmovdqa64_avx512f(*pauVar39);
                    iVar33 = iVar15;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                    }
                    lVar34 = 0;
                    for (iVar33 = 0; iVar33 < iStack_1d4; iVar33 = iVar33 + 1) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                   ((long)pvVar6 + lVar34 + sVar5 * uVar18 * uVar40)
                                                 );
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])(*pauVar24 + lVar34) = auVar2;
                      lVar34 = lVar34 + 0x40;
                    }
                    pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar34);
                    iVar33 = iVar21;
                    while (bVar44 = iVar33 != 0, iVar33 = iVar33 + -1, bVar44) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                    }
                  }
                  for (iVar29 = 0; iVar29 < iStack_1d0; iVar29 = iVar29 + 1) {
                    auVar45 = vmovdqa64_avx512f(*pauVar39);
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                    }
                    for (iVar32 = 0; iVar33 = iVar21, iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar45 = vmovdqa64_avx512f(*pauVar39);
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar39 = pauVar39 + 1;
                      pauVar24 = pauVar24 + 1;
                    }
                    while (iVar33 != 0) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                      iVar33 = iVar33 + -1;
                    }
                  }
                  pauVar39 = (undefined1 (*) [64])((long)pauVar39 + (long)(iStack_1d4 << 4) * -4);
                  iVar29 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar29;
                  }
                  for (; iVar29 != iVar28; iVar29 = iVar29 + 1) {
                    auVar45 = vmovdqa64_avx512f(*pauVar39);
                    iVar32 = iVar15;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                    }
                    lVar34 = 0;
                    for (iVar32 = 0; iVar32 < iStack_1d4; iVar32 = iVar32 + 1) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar39 + lVar34));
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])(*pauVar24 + lVar34) = auVar2;
                      lVar34 = lVar34 + 0x40;
                    }
                    pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar34);
                    iVar32 = iVar21;
                    while (bVar44 = iVar32 != 0, iVar32 = iVar32 + -1, bVar44) {
                      auVar2 = vmovdqa64_avx512f(auVar45);
                      *pauVar24 = auVar2;
                      pauVar24 = pauVar24 + 1;
                    }
                  }
                  iVar15 = (this->super_Padding).type;
                }
                if (iVar15 == 2) {
                  iVar15 = (this->super_Padding).top;
                  uVar25 = (this->super_Padding).left;
                  pauVar24 = (undefined1 (*) [64])
                             ((long)(iStack_1d4 * iVar15 * 0x10) * 4 + local_200._0_8_);
                  uVar18 = 0;
                  uVar42 = 0;
                  if (0 < (int)uVar25) {
                    uVar42 = (ulong)uVar25;
                  }
                  uVar36 = (this->super_Padding).right;
                  uVar30 = (ulong)uVar36;
                  if ((int)uVar36 < 1) {
                    uVar30 = uVar18;
                  }
                  iVar28 = (this->super_Padding).bottom;
                  if (iVar15 < 1) {
                    iVar15 = 0;
                  }
                  lVar34 = uVar42 * 0x40;
                  lVar31 = uVar30 * 0x40;
                  auVar35 = local_180;
                  while( true ) {
                    if ((int)uVar18 == iVar15) break;
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                   (pauVar24[(int)uVar25] + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])(*(undefined1 (*) [64])auVar35 + lVar43) = auVar45;
                      lVar43 = lVar43 + 0x40;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    lVar41 = -0x80;
                    pauVar39 = pauVar24;
                    for (iVar29 = 0; iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      auVar45 = vmovdqa64_avx512f(*pauVar39);
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      pauVar39 = pauVar39 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                    for (; lVar31 + lVar41 != -0x80; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar39 + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                    pauVar24 = pauVar24 + -(long)iStack_1d4;
                    uVar18 = (ulong)((int)uVar18 + 1);
                  }
                  for (iVar15 = 0; iVar15 < iStack_1d0; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                   (pauVar24[(int)uVar25] + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])(*(undefined1 (*) [64])auVar35 + lVar43) = auVar45;
                      lVar43 = lVar43 + 0x40;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    for (iVar29 = 0; lVar41 = -0x80, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      auVar45 = vmovdqa64_avx512f(*pauVar24);
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      pauVar24 = pauVar24 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                    for (; lVar31 + lVar41 != -0x80; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar24 + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                  }
                  pauVar24 = pauVar24 + (long)iStack_1d4 * -2;
                  iVar15 = 0;
                  if (iVar28 < 1) {
                    iVar28 = iVar15;
                  }
                  for (; iVar15 != iVar28; iVar15 = iVar15 + 1) {
                    lVar43 = 0;
                    for (lVar41 = 0; lVar34 + lVar41 != 0; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                   (pauVar24[(int)uVar25] + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])(*(undefined1 (*) [64])auVar35 + lVar43) = auVar45;
                      lVar43 = lVar43 + 0x40;
                    }
                    auVar35 = (undefined1  [8])((long)auVar35 - lVar41);
                    pauVar39 = pauVar24;
                    for (iVar29 = 0; lVar41 = -0x80, iVar29 < iStack_1d4; iVar29 = iVar29 + 1) {
                      auVar45 = vmovdqa64_avx512f(*pauVar39);
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      pauVar39 = pauVar39 + 1;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                    for (; lVar31 + lVar41 != -0x80; lVar41 = lVar41 + -0x40) {
                      auVar45 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar39 + lVar41));
                      auVar45 = vmovdqa64_avx512f(auVar45);
                      *(undefined1 (*) [64])auVar35 = auVar45;
                      auVar35 = (undefined1  [8])((long)auVar35 + 0x40);
                    }
                    pauVar24 = pauVar24 + -(long)iStack_1d4;
                  }
                }
                if ((Allocator *)local_200._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_200._8_8_ =
                       *(int *)(_func_int ***)local_200._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_200._8_8_ == 0) {
                    if (pAStack_1e0 == (Allocator *)0x0) {
                      free((void *)local_200._0_8_);
                    }
                    else {
                      (*pAStack_1e0->_vptr_Allocator[3])();
                    }
                  }
                }
                uVar42 = local_100._0_8_;
                if (uStack_178 != (int *)0x0) {
                  LOCK();
                  *uStack_178 = *uStack_178 + -1;
                  UNLOCK();
                  if (*uStack_178 == 0) {
                    if (pAStack_160 == (Allocator *)0x0) {
                      free((void *)local_180);
                      uVar42 = local_100._0_8_;
                    }
                    else {
                      (*pAStack_160->_vptr_Allocator[3])();
                      uVar42 = local_100._0_8_;
                    }
                  }
                }
              }
              uVar40 = (ulong)((int)uVar40 + 1);
            }
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        iVar29 = iVar33;
        if ((this->super_Padding).type == 0) {
          uVar27 = uVar27 + iVar15 + iVar32;
          Mat::create(top_blob,uVar3 + uVar16 + iVar21,uVar25 + uVar36 + uVar50,uVar27,_c,uVar40,
                      0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar27 < 1) {
              uVar27 = 0;
            }
            if ((int)_c < 1) {
              uVar26 = 0;
            }
            for (uVar40 = 0; uVar40 != uVar26; uVar40 = uVar40 + 1) {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                auVar45 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              }
              else {
                auVar45 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             ((long)(this->super_Padding).per_channel_pad_data.data
                                             + uVar40 * 0x40));
              }
              local_c0[0] = (__m512)vmovdqa64_avx512f(auVar45);
              uVar42 = 0;
              local_100 = vmovdqa64_avx512f(auVar45);
              for (; afVar12 = _local_180, OVar10 = _local_200, uVar42 != uVar27;
                  uVar42 = uVar42 + 1) {
                sVar5 = top_blob->elemsize;
                local_140 = (long)top_blob->h * (long)top_blob->w;
                pauVar24 = (undefined1 (*) [64])
                           ((long)top_blob->data +
                           uVar42 * sVar5 * local_140 + top_blob->cstep * uVar40 * sVar5);
                uStack_178._0_4_ = 0.0;
                uStack_178._4_4_ = 0.0;
                local_180 = (undefined1  [8])pauVar24;
                uStack_170._0_4_ = (float)(int)sVar5;
                uStack_170._4_4_ = (float)(int)(sVar5 >> 0x20);
                _fStack_164 = afVar12._28_36_;
                fStack_168 = (float)top_blob->elempack;
                pAStack_160 = top_blob->allocator;
                iStack_158 = 2;
                iStack_154 = top_blob->w;
                uStack_150 = top_blob->h;
                fStack_144 = afVar12[0xf];
                uStack_14c._0_4_ = 1.4013e-45;
                uStack_14c._4_4_ = 1.4013e-45;
                uVar25 = (int)uVar42 - (this->super_Padding).front;
                if ((int)uVar25 < 0 || iVar32 <= (int)uVar25) {
                  uVar18 = local_140 & 0xffffffff;
                  if ((int)local_140 < 1) {
                    uVar18 = 0;
                  }
                  while (iVar15 = (int)uVar18, uVar18 = (ulong)(iVar15 - 1), iVar15 != 0) {
                    auVar2 = vmovdqu64_avx512f(auVar45);
                    *pauVar24 = auVar2;
                    pauVar24 = pauVar24 + 1;
                  }
                }
                else {
                  iVar15 = bottom_blob->w;
                  local_200._16_8_ = bottom_blob->elemsize;
                  local_1c0 = (long)bottom_blob->h * (long)iVar15;
                  local_200._8_8_ = 0;
                  local_200._0_8_ =
                       (long)bottom_blob->data +
                       (ulong)uVar25 * local_200._16_8_ * local_1c0 +
                       bottom_blob->cstep * uVar40 * local_200._16_8_;
                  auStack_1e4 = OVar10._28_36_;
                  iStack_1e8 = bottom_blob->elempack;
                  pAStack_1e0 = bottom_blob->allocator;
                  iStack_1d8 = 2;
                  iStack_1d4._0_1_ = (bool)(char)iVar15;
                  iStack_1d4._1_1_ = (bool)(char)((uint)iVar15 >> 8);
                  iStack_1d4._2_1_ = (bool)(char)((uint)iVar15 >> 0x10);
                  iStack_1d4._3_1_ = (bool)(char)((uint)iVar15 >> 0x18);
                  iStack_1d0 = bottom_blob->h;
                  auStack_1e4._32_4_ = OVar10._60_4_;
                  uStack_1cc._0_1_ = true;
                  uStack_1cc._1_1_ = false;
                  uStack_1cc._2_1_ = false;
                  uStack_1cc._3_1_ = false;
                  uStack_1cc._4_1_ = true;
                  uStack_1cc._5_1_ = false;
                  uStack_1cc._6_1_ = false;
                  uStack_1cc._7_1_ = false;
                  padding_constant_pack16_avx512
                            ((Mat *)local_200,(Mat *)local_180,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,local_c0);
                  auVar45 = vmovdqa64_avx512f(local_100);
                }
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
  }
  local_100._0_8_ = uVar40;
  piVar4 = bottom_blob->refcount;
  uVar7 = bottom_blob->data;
  uVar8 = bottom_blob->refcount;
  uStack_178 = (int *)uVar8;
  local_180 = (undefined1  [8])uVar7;
  uStack_170._0_4_ = (float)(int)uVar40;
  uStack_170._4_4_ = (float)(int)(uVar40 >> 0x20);
  _fStack_164 = afVar12._28_36_;
  fStack_168 = (float)iVar28;
  pAStack_160 = bottom_blob->allocator;
  iStack_158 = iVar29;
  iStack_154 = iVar21;
  uStack_150 = uVar50;
  uStack_14c._0_4_ = (float)iVar32;
  fStack_144 = afVar12[0xf];
  uStack_14c._4_4_ = (float)_c;
  local_140 = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (iVar28 != 1) {
    auVar45 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar45 = vmovdqa64_avx512f(auVar45);
    stack0xfffffffffffffe10 = auVar45._16_48_;
    local_200._0_8_ = auVar45._0_8_;
    local_200._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)local_180,1,(Option *)local_200);
    if ((local_180 == (undefined1  [8])0x0) || ((long)(int)uStack_14c._4_4_ * local_140 == 0)) {
      iVar15 = -100;
      goto LAB_003c0ad6;
    }
  }
  iVar15 = Padding::forward(&this->super_Padding,(Mat *)local_180,top_blob,opt);
LAB_003c0ad6:
  if (uStack_178 != (int *)0x0) {
    LOCK();
    *uStack_178 = *uStack_178 + -1;
    UNLOCK();
    if (*uStack_178 == 0) {
      if (pAStack_160 == (Allocator *)0x0) {
        free((void *)local_180);
      }
      else {
        (*pAStack_160->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}